

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_access.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Row_access<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>
::insert_entry(Row_access<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>
               *this,ID_index rowIndex,Matrix_entry *entry)

{
  size_type sVar1;
  reference this_00;
  Matrix_entry *entry_local;
  ID_index rowIndex_local;
  Row_access<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>
  *this_local;
  
  if (this->rows_ != (Row_container *)0x0) {
    sVar1 = std::
            vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>_>_>_>
            ::size(this->rows_);
    if (sVar1 < rowIndex + 1) {
      std::
      vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>_>_>_>
      ::resize(this->rows_,(ulong)(rowIndex + 1));
    }
    this_00 = std::
              vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>_>_>_>
              ::operator[](this->rows_,(ulong)rowIndex);
    std::
    set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>_>
    ::insert(this_00,entry);
  }
  return;
}

Assistant:

inline void Row_access<Master_matrix>::insert_entry(ID_index rowIndex, Matrix_entry* entry) 
{
  if (rows_ == nullptr) return;

  if constexpr (!Master_matrix::Option_list::has_removable_rows) {
    if (rows_->size() < rowIndex + 1) rows_->resize(rowIndex + 1);
  }

  // if has_removable_rows should op[] create non existing entry? If not, use try_emplace()
  if constexpr (Master_matrix::Option_list::has_intrusive_rows) {
    rows_->operator[](rowIndex).push_back(*entry);
  } else {
    rows_->operator[](rowIndex).insert(*entry);
  }
}